

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_close.c
# Opt level: O2

int real_close_for_test(int fd)

{
  char *__s;
  Link_map *pLVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  code *pcVar5;
  char *__s1;
  Link_map *link_map;
  
  lVar3 = dlopen(0,2);
  if ((lVar3 != 0) && (iVar2 = dlinfo(lVar3,2,&link_map), -1 < iVar2)) {
    while (pLVar1 = link_map, link_map != (Link_map *)0x0) {
      __s = link_map->l_name;
      pcVar4 = strrchr(__s,0x2f);
      __s1 = pcVar4 + 1;
      if (pcVar4 == (char *)0x0) {
        __s1 = __s;
      }
      iVar2 = strncmp(__s1,"libc.so",7);
      if (iVar2 == 0) {
        lVar3 = dlopen(__s1,1);
        if ((lVar3 != 0) && (pcVar5 = (code *)dlsym(lVar3,"close"), pcVar5 != (code *)0x0)) {
          iVar2 = (*pcVar5)(fd);
          return iVar2;
        }
        break;
      }
      link_map = pLVar1->l_next;
    }
  }
  abort();
}

Assistant:

int
real_close_for_test(int fd)
{
#if defined(__APPLE__)
	return close(fd);
#else
	void *libc_handle;

#if defined(__OpenBSD__)
	struct r_debug *r_debug = NULL;
	for (Elf_Dyn *dyn = _DYNAMIC; dyn->d_tag != DT_NULL; ++dyn) {
		if (dyn->d_tag == DT_DEBUG) {
			r_debug = (struct r_debug *)dyn->d_un.d_ptr;
			break;
		}
	}
	if (!r_debug) {
		abort();
	}
	struct link_map *link_map = r_debug->r_map;
#else
	if ((libc_handle = dlopen(NULL, RTLD_NOW)) == NULL) {
		abort();
	}

#ifdef __linux__
	typedef struct link_map Link_map;
#endif

	Link_map *link_map;
	if (dlinfo(libc_handle, RTLD_DI_LINKMAP, &link_map) < 0) {
		abort();
	}
#endif

	libc_handle = NULL;
	for (; link_map != NULL; link_map = link_map->l_next) {
		char const *libname = strrchr(link_map->l_name, '/');
		libname = libname == NULL ? link_map->l_name : libname + 1;

		if (strncmp(libname, "libc.so", strlen("libc.so")) == 0) {
			libc_handle = dlopen(libname, RTLD_LAZY);
			break;
		}
	}
	if (libc_handle == NULL) {
		abort();
	}

	typeof(close) *real_close = dlsym(libc_handle, "close");
	if (real_close == NULL) {
		abort();
	}

	return real_close(fd);
#endif
}